

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

void ffxmsg(int action,char *errmsg)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  size_t local_28;
  int local_1c;
  char markflag;
  int ii;
  char *errmsg_local;
  int action_local;
  
  if (action == 1) {
    for (local_1c = 0; local_1c < ffxmsg::nummsg; local_1c = local_1c + 1) {
      *ffxmsg::txtbuff[local_1c] = '\0';
    }
    ffxmsg::nummsg = 0;
  }
  else if (action == 2) {
    do {
      if (ffxmsg::nummsg < 1) {
        return;
      }
      ffxmsg::nummsg = ffxmsg::nummsg + -1;
      cVar1 = *ffxmsg::txtbuff[ffxmsg::nummsg];
      *ffxmsg::txtbuff[ffxmsg::nummsg] = '\0';
    } while (cVar1 != '\x1b');
  }
  else if (action == 3) {
    if (0 < ffxmsg::nummsg) {
      ffxmsg::nummsg = ffxmsg::nummsg + -1;
      *ffxmsg::txtbuff[ffxmsg::nummsg] = '\0';
    }
  }
  else if (action == 4) {
    do {
      if (ffxmsg::nummsg < 1) {
        *errmsg = '\0';
        return;
      }
      strcpy(errmsg,ffxmsg::txtbuff[0]);
      *ffxmsg::txtbuff[0] = '\0';
      ffxmsg::nummsg = ffxmsg::nummsg + -1;
      for (local_1c = 0; local_1c < ffxmsg::nummsg; local_1c = local_1c + 1) {
        ffxmsg::txtbuff[local_1c] = ffxmsg::txtbuff[local_1c + 1];
      }
    } while (*errmsg == '\x1b');
  }
  else {
    pcVar2 = errmsg;
    if (action == 5) {
      while (ffxmsg::msgptr = pcVar2, sVar3 = strlen(ffxmsg::msgptr), sVar3 != 0) {
        if (ffxmsg::nummsg == 0x19) {
          ffxmsg::tmpbuff = ffxmsg::txtbuff[0];
          *ffxmsg::txtbuff[0] = '\0';
          ffxmsg::nummsg = ffxmsg::nummsg + -1;
          for (local_1c = 0; local_1c < ffxmsg::nummsg; local_1c = local_1c + 1) {
            ffxmsg::txtbuff[local_1c] = ffxmsg::txtbuff[local_1c + 1];
          }
          ffxmsg::txtbuff[ffxmsg::nummsg] = ffxmsg::tmpbuff;
        }
        else {
          for (local_1c = 0; local_1c < 0x19; local_1c = local_1c + 1) {
            if (ffxmsg::errbuff[local_1c][0] == '\0') {
              ffxmsg::txtbuff[ffxmsg::nummsg] = ffxmsg::errbuff[local_1c];
              break;
            }
          }
        }
        strncat(ffxmsg::txtbuff[ffxmsg::nummsg],ffxmsg::msgptr,0x50);
        ffxmsg::nummsg = ffxmsg::nummsg + 1;
        sVar3 = strlen(ffxmsg::msgptr);
        if (sVar3 < 0x51) {
          local_28 = strlen(ffxmsg::msgptr);
        }
        else {
          local_28 = 0x50;
        }
        pcVar2 = ffxmsg::msgptr + local_28;
      }
    }
    else if (action == 6) {
      if (ffxmsg::nummsg == 0x19) {
        ffxmsg::tmpbuff = ffxmsg::txtbuff[0];
        *ffxmsg::txtbuff[0] = '\0';
        ffxmsg::nummsg = ffxmsg::nummsg + -1;
        for (local_1c = 0; local_1c < ffxmsg::nummsg; local_1c = local_1c + 1) {
          ffxmsg::txtbuff[local_1c] = ffxmsg::txtbuff[local_1c + 1];
        }
        ffxmsg::txtbuff[ffxmsg::nummsg] = ffxmsg::tmpbuff;
      }
      else {
        for (local_1c = 0; local_1c < 0x19; local_1c = local_1c + 1) {
          if (ffxmsg::errbuff[local_1c][0] == '\0') {
            ffxmsg::txtbuff[ffxmsg::nummsg] = ffxmsg::errbuff[local_1c];
            break;
          }
        }
      }
      *ffxmsg::txtbuff[ffxmsg::nummsg] = '\x1b';
      ffxmsg::txtbuff[ffxmsg::nummsg][1] = '\0';
      ffxmsg::nummsg = ffxmsg::nummsg + 1;
    }
  }
  return;
}

Assistant:

void ffxmsg( int action,
            char *errmsg)
/*
  general routine to get, put, or clear the error message stack.
  Use a static array rather than allocating memory as needed for
  the error messages because it is likely to be more efficient
  and simpler to implement.

  Action Code:
DelAll     1  delete all messages on the error stack 
DelMark    2  delete messages back to and including the 1st marker 
DelNewest  3  delete the newest message from the stack 
GetMesg    4  pop and return oldest message, ignoring marks 
PutMesg    5  add a new message to the stack 
PutMark    6  add a marker to the stack 

*/
{
    int ii;
    char markflag;
    static char *txtbuff[errmsgsiz], *tmpbuff, *msgptr;
    static char errbuff[errmsgsiz][81];  /* initialize all = \0 */
    static int nummsg = 0;

    FFLOCK;
    
    if (action == DelAll)  /* clear the whole message stack */
    {
      for (ii = 0; ii < nummsg; ii ++)
        *txtbuff[ii] = '\0';

      nummsg = 0;
    }
    else if (action == DelMark)  /* clear up to and including first marker */
    {
      while (nummsg > 0) {
        nummsg--;  
        markflag = *txtbuff[nummsg]; /* store possible marker character */
        *txtbuff[nummsg] = '\0';  /* clear the buffer for this msg */

        if (markflag == ESMARKER)
           break;   /* found a marker, so quit */
      }
    }
    else if (action == DelNewest)  /* remove newest message from stack */ 
    {
      if (nummsg > 0)
      {
        nummsg--;  
        *txtbuff[nummsg] = '\0';  /* clear the buffer for this msg */
      }
    }
    else if (action == GetMesg)  /* pop and return oldest message from stack */ 
    {                            /* ignoring markers */
      while (nummsg > 0)
      {
         strcpy(errmsg, txtbuff[0]);   /* copy oldest message to output */

         *txtbuff[0] = '\0';  /* clear the buffer for this msg */
           
         nummsg--;  
         for (ii = 0; ii < nummsg; ii++)
             txtbuff[ii] = txtbuff[ii + 1]; /* shift remaining pointers */

         if (errmsg[0] != ESMARKER) {   /* quit if this is not a marker */
            FFUNLOCK;
            return;
         }
       }
       errmsg[0] = '\0';  /*  no messages in the stack */
    }
    else if (action == PutMesg)  /* add new message to stack */
    {
     msgptr = errmsg;
     while (strlen(msgptr))
     {
      if (nummsg == errmsgsiz)
      {
        tmpbuff = txtbuff[0];  /* buffers full; reuse oldest buffer */
        *txtbuff[0] = '\0';  /* clear the buffer for this msg */

        nummsg--;
        for (ii = 0; ii < nummsg; ii++)
             txtbuff[ii] = txtbuff[ii + 1];   /* shift remaining pointers */

        txtbuff[nummsg] = tmpbuff;  /* set pointer for the new message */
      }
      else
      {
        for (ii = 0; ii < errmsgsiz; ii++)
        {
          if (*errbuff[ii] == '\0') /* find first empty buffer */
          {
            txtbuff[nummsg] = errbuff[ii];
            break;
          }
        }
      }

      strncat(txtbuff[nummsg], msgptr, 80);
      nummsg++;

      msgptr += minvalue(80, strlen(msgptr));
     }
    }
    else if (action == PutMark)  /* put a marker on the stack */
    {
      if (nummsg == errmsgsiz)
      {
        tmpbuff = txtbuff[0];  /* buffers full; reuse oldest buffer */
        *txtbuff[0] = '\0';  /* clear the buffer for this msg */

        nummsg--;
        for (ii = 0; ii < nummsg; ii++)
             txtbuff[ii] = txtbuff[ii + 1];   /* shift remaining pointers */

        txtbuff[nummsg] = tmpbuff;  /* set pointer for the new message */
      }
      else
      {
        for (ii = 0; ii < errmsgsiz; ii++)
        {
          if (*errbuff[ii] == '\0') /* find first empty buffer */
          {
            txtbuff[nummsg] = errbuff[ii];
            break;
          }
        }
      }

      *txtbuff[nummsg] = ESMARKER;      /* write the marker */
      *(txtbuff[nummsg] + 1) = '\0';
      nummsg++;

    }

    FFUNLOCK;
    return;
}